

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawListSplitter::Split(ImDrawListSplitter *this,ImDrawList *draw_list,int channels_count)

{
  ImVec4 *pIVar1;
  int iVar2;
  ImDrawChannel *pIVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ImVector<ImDrawCmd> *this_00;
  long lVar8;
  long lVar9;
  ImDrawCmd draw_cmd;
  
  iVar2 = (this->_Channels).Size;
  if (iVar2 < channels_count) {
    ImVector<ImDrawChannel>::resize(&this->_Channels,channels_count);
  }
  this->_Count = channels_count;
  pIVar3 = (this->_Channels).Data;
  (pIVar3->_IdxBuffer).Size = 0;
  (pIVar3->_IdxBuffer).Capacity = 0;
  (pIVar3->_IdxBuffer).Data = (uint *)0x0;
  (pIVar3->_CmdBuffer).Size = 0;
  (pIVar3->_CmdBuffer).Capacity = 0;
  (pIVar3->_CmdBuffer).Data = (ImDrawCmd *)0x0;
  lVar8 = 0x20;
  for (lVar9 = 1; lVar9 < channels_count; lVar9 = lVar9 + 1) {
    this_00 = (ImVector<ImDrawCmd> *)((long)&(((this->_Channels).Data)->_CmdBuffer).Size + lVar8);
    if (lVar9 < iVar2) {
      ImVector<ImDrawCmd>::resize(this_00,0);
      ImVector<unsigned_int>::resize
                ((ImVector<unsigned_int> *)
                 ((long)&(((this->_Channels).Data)->_IdxBuffer).Size + lVar8),0);
    }
    else {
      this_00[1].Size = 0;
      this_00[1].Capacity = 0;
      this_00[1].Data = (ImDrawCmd *)0x0;
      this_00->Size = 0;
      this_00->Capacity = 0;
      this_00->Data = (ImDrawCmd *)0x0;
    }
    pIVar3 = (this->_Channels).Data;
    if (*(int *)((long)&(pIVar3->_CmdBuffer).Size + lVar8) == 0) {
      draw_cmd.ElemCount = 0;
      draw_cmd.UserCallback = (ImDrawCallback)0x0;
      draw_cmd.UserCallbackData = (void *)0x0;
      draw_cmd.VtxOffset = 0;
      draw_cmd.IdxOffset = 0;
      pIVar1 = (draw_list->_ClipRectStack).Data + (long)(draw_list->_ClipRectStack).Size + -1;
      uVar4 = pIVar1->x;
      uVar5 = pIVar1->y;
      uVar6 = pIVar1->z;
      uVar7 = pIVar1->w;
      draw_cmd.TextureId =
           (draw_list->_TextureIdStack).Data[(long)(draw_list->_TextureIdStack).Size + -1];
      draw_cmd.ClipRect.x = (float)uVar4;
      draw_cmd.ClipRect.y = (float)uVar5;
      draw_cmd.ClipRect.z = (float)uVar6;
      draw_cmd.ClipRect.w = (float)uVar7;
      ImVector<ImDrawCmd>::push_back
                ((ImVector<ImDrawCmd> *)((long)&(pIVar3->_CmdBuffer).Size + lVar8),&draw_cmd);
    }
    lVar8 = lVar8 + 0x20;
  }
  return;
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_ASSERT(_Current == 0 && _Count <= 1);
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
        if (_Channels[i]._CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            draw_cmd.ClipRect = draw_list->_ClipRectStack.back();
            draw_cmd.TextureId = draw_list->_TextureIdStack.back();
            _Channels[i]._CmdBuffer.push_back(draw_cmd);
        }
    }
}